

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O2

void __thiscall imrt::Station::printAperture(Station *this,int aperture)

{
  int iVar1;
  ostream *poVar2;
  int i;
  long lVar3;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"Station: ");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,this->angle);
  poVar2 = std::operator<<(poVar2," aperture: ");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,aperture);
  std::operator<<(poVar2," intensity ");
  poVar2 = std::ostream::_M_insert<double>
                     ((this->intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[aperture]);
  std::endl<char,std::char_traits<char>>(poVar2);
  lVar3 = 0;
  while( true ) {
    iVar1 = Collimator::getXdim(this->collimator);
    if (iVar1 <= lVar3) break;
    poVar2 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)&std::cout,
                        *(int *)(*(long *)&(this->A).
                                           super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[aperture].
                                           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                           ._M_impl.super__Vector_impl_data + lVar3 * 8));
    poVar2 = std::operator<<(poVar2,"-");
    poVar2 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)poVar2,
                        *(int *)(*(long *)&(this->A).
                                           super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[aperture].
                                           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                           ._M_impl.super__Vector_impl_data + 4 + lVar3 * 8));
    std::endl<char,std::char_traits<char>>(poVar2);
    lVar3 = lVar3 + 1;
  }
  return;
}

Assistant:

void Station::printAperture(int aperture) {
    cout << "Station: "<< angle << " aperture: " << aperture << " intensity "<< intensity[aperture]<< endl;
    for (int i=0; i<collimator.getXdim(); i++) {
      cout << A[aperture][i].first << "-" << A[aperture][i].second << endl;
    }
  }